

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O0

void CompareSilfTables(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,
                      int *pchwMaxGlyphID)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  ushort uVar5;
  short sVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long *in_RCX;
  long *in_RDX;
  GrIStream *in_RSI;
  GrIStream *in_RDI;
  uint *in_R8;
  int unicodeT;
  int unicodeB;
  int cpsd;
  bool fPassesOk;
  int rgnPassOffsets [128];
  int cBehaviorsT;
  int cBehaviorsB;
  int i_3;
  byte rgb_1 [8];
  int cJLevels_2;
  int i_2;
  byte rgb [8];
  int cJLevels_1;
  int i_1;
  int cJLevels;
  byte bB;
  byte bT;
  byte ipassReordered1;
  byte ipassJust1;
  byte ipassPos1;
  byte ipassSub1;
  byte cPasses;
  long lPseudosPosT;
  long lPassBlockPosT;
  long lPseudosPosB;
  long lPassBlockPosB;
  uint32_t fxdRuleVersionT;
  uint32_t fxdRuleVersionB;
  long lSubTableStartT;
  long lSubTableStartB;
  int i;
  int nSubTableOffsetsT [256];
  int nSubTableOffsetsB [256];
  unsigned_short cSubTablesT;
  unsigned_short cSubTablesB;
  int fxdSilfVersionT;
  int fxdSilfVersionB;
  undefined4 in_stack_ffffffffffffe950;
  undefined4 in_stack_ffffffffffffe954;
  GrIStream *in_stack_ffffffffffffe9c8;
  allocator *in_stack_ffffffffffffe9d0;
  undefined4 in_stack_ffffffffffffe9d8;
  undefined4 in_stack_ffffffffffffe9dc;
  GrIStream *in_stack_ffffffffffffe9e0;
  uint in_stack_ffffffffffffec54;
  GrIStream *in_stack_ffffffffffffec58;
  GrIStream *in_stack_ffffffffffffec60;
  allocator *in_stack_ffffffffffffec68;
  undefined4 in_stack_ffffffffffffec70;
  uint in_stack_ffffffffffffec74;
  int local_11d0;
  int local_11cc;
  allocator local_1179;
  string local_1178 [39];
  allocator local_1151;
  string local_1150 [36];
  uint local_112c;
  uint local_1128;
  allocator local_1121;
  string local_1120 [39];
  allocator local_10f9;
  string local_10f8 [39];
  allocator local_10d1;
  string local_10d0 [39];
  allocator local_10a9;
  string local_10a8 [32];
  uint local_1088;
  allocator local_1081;
  string local_1080 [39];
  byte local_1059;
  int local_1058 [94];
  int in_stack_fffffffffffff120;
  int in_stack_fffffffffffff124;
  GrIStream *in_stack_fffffffffffff128;
  GrIStream *in_stack_fffffffffffff130;
  TestCase *in_stack_fffffffffffff138;
  int *in_stack_fffffffffffff140;
  int in_stack_fffffffffffff150;
  int in_stack_fffffffffffff158;
  int in_stack_fffffffffffff160;
  int *in_stack_fffffffffffff168;
  allocator local_e49;
  string local_e48 [39];
  allocator local_e21;
  string local_e20 [36];
  uint local_dfc;
  uint local_df8;
  allocator local_df1;
  string local_df0 [39];
  allocator local_dc9;
  string local_dc8 [39];
  allocator local_da1;
  string local_da0 [39];
  allocator local_d79;
  string local_d78 [39];
  allocator local_d51;
  string local_d50 [39];
  allocator local_d29;
  string local_d28 [39];
  allocator local_d01;
  string local_d00 [39];
  allocator local_cd9;
  string local_cd8 [32];
  int local_cb8;
  undefined1 local_cb1 [8];
  allocator local_ca9;
  string local_ca8 [36];
  uint local_c84;
  int local_c80;
  undefined1 local_c79 [8];
  allocator local_c71;
  string local_c70 [32];
  uint local_c50;
  allocator local_c49;
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [39];
  allocator local_bf9;
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [32];
  int local_bb0;
  allocator local_ba9;
  string local_ba8 [32];
  uint local_b88;
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [39];
  allocator local_b31;
  string local_b30 [39];
  allocator local_b09;
  string local_b08 [39];
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90 [39];
  allocator local_a69;
  string local_a68 [37];
  byte local_a43;
  byte local_a42;
  allocator local_a41;
  string local_a40 [38];
  char local_a1a;
  allocator local_a19;
  string local_a18 [38];
  char local_9f2;
  allocator local_9f1;
  string local_9f0 [38];
  char local_9ca;
  allocator local_9c9;
  string local_9c8 [38];
  char local_9a2;
  allocator local_9a1;
  string local_9a0 [38];
  byte local_97a;
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [32];
  long local_908;
  long local_900;
  long local_8f8;
  long local_8f0;
  int local_8e8;
  int local_8e4;
  long local_8e0;
  long local_8d8;
  int local_8cc;
  int local_8c8 [256];
  int local_4c8 [259];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  ushort local_70;
  ushort local_6e;
  allocator local_59;
  string local_58 [32];
  int local_38;
  int local_34;
  uint *local_30;
  long *local_28;
  long *local_20;
  GrIStream *local_18;
  GrIStream *local_10;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_34 = ReadVersion((GrIStream *)CONCAT44(in_stack_ffffffffffffe954,in_stack_ffffffffffffe950))
  ;
  local_38 = ReadVersion((GrIStream *)CONCAT44(in_stack_ffffffffffffe954,in_stack_ffffffffffffe950))
  ;
  iVar9 = (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20);
  if (local_38 < 0x50001) {
    if (0x2ffff < local_34) {
      (**(code **)(*local_20 + 0x20))();
    }
    if (0x2ffff < local_38) {
      (**(code **)(*local_28 + 0x20))();
    }
    local_6e = (**(code **)(*local_20 + 0x18))();
    local_70 = (**(code **)(*local_28 + 0x18))();
    iVar9 = (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20);
    if (local_70 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"ERROR: Silf table has no subtable",&local_91);
      OutputError((int *)in_stack_ffffffffffffe9e0,
                  (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                  (string *)in_stack_ffffffffffffe9d0,iVar9);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    else {
      if (1 < local_70) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b8,"ERROR: Silf table has greater than 1 subtable",&local_b9);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      if (0x1ffff < local_34) {
        (**(code **)(*local_20 + 0x10))();
      }
      if (0x1ffff < local_38) {
        (**(code **)(*local_28 + 0x10))();
      }
      for (local_8cc = 0; local_8cc < (int)(uint)local_6e; local_8cc = local_8cc + 1) {
        iVar9 = (**(code **)(*local_20 + 0x20))();
        local_4c8[local_8cc] = iVar9;
      }
      for (local_8cc = 0; local_8cc < (int)(uint)local_70; local_8cc = local_8cc + 1) {
        iVar9 = (**(code **)(*local_28 + 0x20))();
        local_8c8[local_8cc] = iVar9;
      }
      (**(code **)(*local_20 + 0x38))(local_20,(long)local_4c8[0]);
      (**(code **)(*local_28 + 0x38))(local_28,(long)local_8c8[0]);
      (**(code **)(*local_20 + 0x30))(local_20,&local_8d8);
      (**(code **)(*local_28 + 0x30))(local_28,&local_8e0);
      if (local_34 < 0x30000) {
        local_11cc = local_34;
      }
      else {
        local_11cc = ReadVersion((GrIStream *)
                                 CONCAT44(in_stack_ffffffffffffe954,in_stack_ffffffffffffe950));
      }
      local_8e4 = local_11cc;
      if (local_38 < 0x30000) {
        local_11d0 = local_38;
      }
      else {
        local_11d0 = ReadVersion((GrIStream *)
                                 CONCAT44(in_stack_ffffffffffffe954,in_stack_ffffffffffffe950));
      }
      local_8e8 = local_11d0;
      local_8f0 = -1;
      local_8f8 = -1;
      if (0x2ffff < local_34) {
        uVar5 = (**(code **)(*local_20 + 0x18))();
        local_8f0 = (ulong)uVar5 + local_8d8;
        uVar5 = (**(code **)(*local_20 + 0x18))();
        local_8f8 = (ulong)uVar5 + local_8d8;
      }
      local_900 = -1;
      local_908 = -1;
      if (0x2ffff < local_38) {
        uVar5 = (**(code **)(*local_28 + 0x18))();
        local_900 = (ulong)uVar5 + local_8e0;
        uVar5 = (**(code **)(*local_28 + 0x18))();
        local_908 = (ulong)uVar5 + local_8e0;
      }
      uVar5 = (**(code **)(*local_20 + 0x18))();
      *local_30 = (uint)uVar5;
      uVar5 = (**(code **)(*local_28 + 0x18))();
      if ((uint)uVar5 != *local_30) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_928,"ERROR: Silf table - maxiumum glyph ID",&local_929);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_928);
        std::allocator<char>::~allocator((allocator<char> *)&local_929);
        *local_30 = 0xffffffff;
      }
      sVar6 = (**(code **)(*local_20 + 0x10))();
      sVar7 = (**(code **)(*local_28 + 0x10))();
      if (sVar6 != sVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_950,"ERROR: Silf table - extra ascent",&local_951);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_950);
        std::allocator<char>::~allocator((allocator<char> *)&local_951);
      }
      sVar6 = (**(code **)(*local_20 + 0x10))();
      sVar7 = (**(code **)(*local_28 + 0x10))();
      if (sVar6 != sVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_978,"ERROR: Silf table - extra descent",&local_979);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_978);
        std::allocator<char>::~allocator((allocator<char> *)&local_979);
      }
      bVar1 = (**(code **)(*local_20 + 8))();
      local_97a = bVar1;
      bVar2 = (**(code **)(*local_28 + 8))();
      if (bVar1 != bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_9a0,"ERROR: Silf table - number of passes",&local_9a1);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_9a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_9a2 = cVar3;
      cVar4 = (**(code **)(*local_28 + 8))();
      if (cVar3 != cVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_9c8,"ERROR: Silf table - first substitution pass",&local_9c9);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_9c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_9ca = cVar3;
      cVar4 = (**(code **)(*local_28 + 8))();
      if (cVar3 != cVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_9f0,"ERROR: Silf table - first positioning pass",&local_9f1);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_9f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_9f2 = cVar3;
      cVar4 = (**(code **)(*local_28 + 8))();
      if (cVar3 != cVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a18,"ERROR: Silf table - first justification pass",&local_a19);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_a18);
        std::allocator<char>::~allocator((allocator<char> *)&local_a19);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_a1a = cVar3;
      cVar4 = (**(code **)(*local_28 + 8))();
      if (cVar3 != cVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a40,"ERROR: Silf table - first reordered pass",&local_a41);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_a40);
        std::allocator<char>::~allocator((allocator<char> *)&local_a41);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_a43 = cVar3;
      local_a42 = (**(code **)(*local_28 + 8))();
      if (cVar3 != local_a42) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a68,"ERROR: Silf table - flags",&local_a69);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_a68);
        std::allocator<char>::~allocator((allocator<char> *)&local_a69);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_a43 = cVar3;
      local_a42 = (**(code **)(*local_28 + 8))();
      if (cVar3 != local_a42) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a90,"ERROR: Silf table - pre LB context",&local_a91);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_a90);
        std::allocator<char>::~allocator((allocator<char> *)&local_a91);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_a43 = cVar3;
      local_a42 = (**(code **)(*local_28 + 8))();
      if (cVar3 != local_a42) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ab8,"ERROR: Silf table - post LB context",&local_ab9);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_ab8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_a43 = cVar3;
      local_a42 = (**(code **)(*local_28 + 8))();
      if (cVar3 != local_a42) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_ae0,"ERROR: Silf table - actual-for-pseudo attr",&local_ae1);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_ae0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      local_a43 = cVar3;
      local_a42 = (**(code **)(*local_28 + 8))();
      if (cVar3 != local_a42) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b08,"ERROR: Silf table - breakweight attr",&local_b09);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_b08);
        std::allocator<char>::~allocator((allocator<char> *)&local_b09);
      }
      bVar1 = (**(code **)(*local_20 + 8))();
      local_a43 = bVar1;
      local_a42 = (**(code **)(*local_28 + 8))();
      if (bVar1 != local_a42) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b30,"ERROR: Silf table - directionality attr",&local_b31)
        ;
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_b30);
        std::allocator<char>::~allocator((allocator<char> *)&local_b31);
      }
      if ((local_34 < 0x20000) || (local_38 < 0x20000)) {
        if (local_34 < 0x20000) {
          if (0x1ffff < local_38) {
            (**(code **)(*local_20 + 8))();
            (**(code **)(*local_20 + 8))();
            bVar1 = (**(code **)(*local_20 + 8))();
            local_c84 = (uint)bVar1;
            if (local_c84 != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_ca8,"ERROR: Silf table - justification data found but not expected",
                         &local_ca9);
              OutputError((int *)in_stack_ffffffffffffe9e0,
                          (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                          (string *)in_stack_ffffffffffffe9d0,
                          (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
              std::__cxx11::string::~string(local_ca8);
              std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
            }
            for (local_cb8 = 0; local_cb8 < (int)local_c84; local_cb8 = local_cb8 + 1) {
              (**(code **)(*local_20 + 0x28))(local_20,local_cb1,8);
            }
          }
        }
        else {
          (**(code **)(*local_20 + 8))();
          (**(code **)(*local_20 + 8))();
          bVar1 = (**(code **)(*local_20 + 8))();
          local_c50 = (uint)bVar1;
          if (local_c50 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_c70,"ERROR: Silf table - missing justification data",&local_c71);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_c70);
            std::allocator<char>::~allocator((allocator<char> *)&local_c71);
          }
          for (local_c80 = 0; local_c80 < (int)local_c50; local_c80 = local_c80 + 1) {
            (**(code **)(*local_20 + 0x28))(local_20,local_c79,8);
          }
        }
      }
      else {
        if (local_34 < 0x40000) {
          (**(code **)(*local_20 + 8))();
          (**(code **)(*local_28 + 8))();
          (**(code **)(*local_20 + 8))();
          (**(code **)(*local_28 + 8))();
        }
        else {
          local_a43 = (**(code **)(*local_20 + 8))();
          in_stack_ffffffffffffec74 = (uint)local_a43;
          local_a42 = (**(code **)(*local_28 + 8))();
          if (in_stack_ffffffffffffec74 != local_a42) {
            in_stack_ffffffffffffec68 = &local_b59;
            in_stack_ffffffffffffec58 = local_10;
            in_stack_ffffffffffffec60 = local_18;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_b58,"ERROR: Silf table - mirroring attrs",in_stack_ffffffffffffec68);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_b58);
            std::allocator<char>::~allocator((allocator<char> *)&local_b59);
          }
          local_a43 = (**(code **)(*local_20 + 8))();
          in_stack_ffffffffffffec54 = (uint)local_a43;
          local_a42 = (**(code **)(*local_28 + 8))();
          if (in_stack_ffffffffffffec54 != local_a42) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_b80,"ERROR: Silf table - skip-passes attr",&local_b81);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_b80);
            std::allocator<char>::~allocator((allocator<char> *)&local_b81);
          }
        }
        bVar1 = (**(code **)(*local_20 + 8))();
        local_b88 = (uint)bVar1;
        bVar2 = (**(code **)(*local_28 + 8))();
        iVar9 = (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20);
        if ((uint)bVar1 != (uint)bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_ba8,"ERROR: Silf table - justification levels",&local_ba9);
          OutputError((int *)in_stack_ffffffffffffe9e0,
                      (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                      (string *)in_stack_ffffffffffffe9d0,iVar9);
          std::__cxx11::string::~string(local_ba8);
          std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
          return;
        }
        for (local_bb0 = 0; local_bb0 < (int)local_b88; local_bb0 = local_bb0 + 1) {
          cVar3 = (**(code **)(*local_20 + 8))();
          cVar4 = (**(code **)(*local_28 + 8))();
          if (cVar3 != cVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_bd0,"ERROR: Silf table - stretch",&local_bd1);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_bd0);
            std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
          }
          cVar3 = (**(code **)(*local_20 + 8))();
          cVar4 = (**(code **)(*local_28 + 8))();
          if (cVar3 != cVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_bf8,"ERROR: Silf table - shrink",&local_bf9);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_bf8);
            std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
          }
          cVar3 = (**(code **)(*local_20 + 8))();
          cVar4 = (**(code **)(*local_28 + 8))();
          if (cVar3 != cVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_c20,"ERROR: Silf table - step",&local_c21);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_c20);
            std::allocator<char>::~allocator((allocator<char> *)&local_c21);
          }
          cVar3 = (**(code **)(*local_20 + 8))();
          cVar4 = (**(code **)(*local_28 + 8))();
          if (cVar3 != cVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_c48,"ERROR: Silf table - weight",&local_c49);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_c48);
            std::allocator<char>::~allocator((allocator<char> *)&local_c49);
          }
          (**(code **)(*local_20 + 8))();
          (**(code **)(*local_28 + 8))();
          (**(code **)(*local_20 + 8))();
          (**(code **)(*local_20 + 8))();
          (**(code **)(*local_20 + 8))();
          (**(code **)(*local_28 + 8))();
          (**(code **)(*local_28 + 8))();
          (**(code **)(*local_28 + 8))();
        }
      }
      sVar6 = (**(code **)(*local_20 + 0x18))();
      sVar7 = (**(code **)(*local_28 + 0x18))();
      if (sVar6 != sVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_cd8,"ERROR: Silf table - number of components",&local_cd9);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_cd8);
        std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      cVar4 = (**(code **)(*local_28 + 8))();
      if (cVar3 != cVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_d00,"ERROR: Silf table - number of user-defined slot attributes",&local_d01
                  );
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_d00);
        std::allocator<char>::~allocator((allocator<char> *)&local_d01);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      cVar4 = (**(code **)(*local_28 + 8))();
      if (cVar3 != cVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_d28,"ERROR: Silf table - max number of ligature components",&local_d29);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_d28);
        std::allocator<char>::~allocator((allocator<char> *)&local_d29);
      }
      cVar3 = (**(code **)(*local_20 + 8))();
      cVar4 = (**(code **)(*local_28 + 8))();
      if (cVar3 != cVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_d50,"ERROR: Silf table - supported directions",&local_d51);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_d50);
        std::allocator<char>::~allocator((allocator<char> *)&local_d51);
      }
      if (local_34 < 0x40001) {
        (**(code **)(*local_20 + 8))();
        (**(code **)(*local_28 + 8))();
      }
      else {
        cVar3 = (**(code **)(*local_20 + 8))();
        cVar4 = (**(code **)(*local_28 + 8))();
        if (cVar3 != cVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d78,"ERROR: Silf table - collision attributes",&local_d79);
          OutputError((int *)in_stack_ffffffffffffe9e0,
                      (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                      (string *)in_stack_ffffffffffffe9d0,
                      (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
          std::__cxx11::string::~string(local_d78);
          std::allocator<char>::~allocator((allocator<char> *)&local_d79);
        }
      }
      (**(code **)(*local_20 + 8))();
      (**(code **)(*local_20 + 8))();
      (**(code **)(*local_28 + 8))();
      (**(code **)(*local_28 + 8))();
      if ((local_34 < 0x20000) || (local_38 < 0x20000)) {
        if (local_34 < 0x20000) {
          if (0x1ffff < local_38) {
            (**(code **)(*local_28 + 8))();
            cVar3 = (**(code **)(*local_28 + 8))();
            if (cVar3 != '\0') {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_df0,"ERROR: Silf table - critical features found but not expected",
                         &local_df1);
              OutputError((int *)in_stack_ffffffffffffe9e0,
                          (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                          (string *)in_stack_ffffffffffffe9d0,
                          (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
              std::__cxx11::string::~string(local_df0);
              std::allocator<char>::~allocator((allocator<char> *)&local_df1);
            }
            (**(code **)(*local_28 + 8))();
          }
        }
        else {
          (**(code **)(*local_20 + 8))();
          cVar3 = (**(code **)(*local_20 + 8))();
          if (cVar3 != '\0') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_dc8,"ERROR: Silf table - critical features not equal to zero",
                       &local_dc9);
            OutputError((int *)in_stack_ffffffffffffe9e0,
                        (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                        (string *)in_stack_ffffffffffffe9d0,
                        (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
            std::__cxx11::string::~string(local_dc8);
            std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
          }
          (**(code **)(*local_20 + 8))();
        }
      }
      else {
        (**(code **)(*local_20 + 8))();
        (**(code **)(*local_28 + 8))();
        cVar3 = (**(code **)(*local_20 + 8))();
        cVar4 = (**(code **)(*local_28 + 8))();
        if (cVar3 != cVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_da0,"ERROR: Silf table - critical features",&local_da1)
          ;
          OutputError((int *)in_stack_ffffffffffffe9e0,
                      (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                      (string *)in_stack_ffffffffffffe9d0,
                      (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
          std::__cxx11::string::~string(local_da0);
          std::allocator<char>::~allocator((allocator<char> *)&local_da1);
        }
        (**(code **)(*local_20 + 8))();
        (**(code **)(*local_28 + 8))();
      }
      bVar1 = (**(code **)(*local_20 + 8))();
      local_df8 = (uint)bVar1;
      bVar1 = (**(code **)(*local_28 + 8))();
      local_dfc = (uint)bVar1;
      if (local_df8 != local_dfc) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e20,"ERROR: Silf table - rendering behaviors",&local_e21)
        ;
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_e20);
        std::allocator<char>::~allocator((allocator<char> *)&local_e21);
      }
      for (local_8cc = 0; local_8cc < (int)local_df8; local_8cc = local_8cc + 1) {
        (**(code **)(*local_20 + 0x18))();
      }
      for (local_8cc = 0; local_8cc < (int)local_dfc; local_8cc = local_8cc + 1) {
        (**(code **)(*local_28 + 0x18))();
      }
      sVar6 = (**(code **)(*local_20 + 0x18))();
      sVar7 = (**(code **)(*local_28 + 0x18))();
      if (sVar6 != sVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e48,"ERROR: Silf table - linebreak glyph ID",&local_e49);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_e48);
        std::allocator<char>::~allocator((allocator<char> *)&local_e49);
      }
      if (0x2ffff < local_34) {
        (**(code **)(*local_20 + 0x38))(local_20,local_8f0);
      }
      if (0x2ffff < local_38) {
        (**(code **)(*local_28 + 0x38))(local_28,local_900);
      }
      local_1059 = 1;
      for (local_8cc = 0; local_8cc <= (int)(uint)local_97a; local_8cc = local_8cc + 1) {
        iVar9 = (**(code **)(*local_20 + 0x20))();
        local_1058[local_8cc] = iVar9;
        iVar9 = local_1058[local_8cc];
        iVar10 = (**(code **)(*local_28 + 0x20))();
        if (iVar9 != iVar10) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1080,"ERROR: Silf table - pass offsets",&local_1081);
          OutputError((int *)in_stack_ffffffffffffe9e0,
                      (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                      (string *)in_stack_ffffffffffffe9d0,
                      (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
          std::__cxx11::string::~string(local_1080);
          std::allocator<char>::~allocator((allocator<char> *)&local_1081);
          local_1059 = 0;
        }
      }
      if (0x2ffff < local_34) {
        (**(code **)(*local_20 + 0x38))(local_20,local_8f8);
      }
      if (0x2ffff < local_38) {
        (**(code **)(*local_28 + 0x38))(local_28,local_908);
      }
      uVar5 = (**(code **)(*local_20 + 0x18))();
      local_1088 = (uint)uVar5;
      uVar8 = (**(code **)(*local_28 + 0x18))();
      if ((uint)uVar5 != (uint)uVar8) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_10a8,"ERROR: Silf table - pseudo search count",&local_10a9);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_10a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
      }
      sVar6 = (**(code **)(*local_20 + 0x18))();
      sVar7 = (**(code **)(*local_28 + 0x18))();
      if (sVar6 != sVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_10d0,"ERROR: Silf table - pseudo search increment",&local_10d1);
        OutputError((int *)local_10,
                    (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_10d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
        in_stack_ffffffffffffe9e0 = local_10;
      }
      uVar5 = (**(code **)(*local_20 + 0x18))();
      uVar11 = (uint)uVar5;
      uVar5 = (**(code **)(*local_28 + 0x18))();
      if (uVar11 != uVar5) {
        in_stack_ffffffffffffe9d0 = &local_10f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_10f8,"ERROR: Silf table - pseudo search loop",in_stack_ffffffffffffe9d0);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(uVar11,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,(int)((ulong)local_18 >> 0x20));
        std::__cxx11::string::~string(local_10f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
        in_stack_ffffffffffffe9c8 = local_18;
      }
      sVar6 = (**(code **)(*local_20 + 0x18))();
      sVar7 = (**(code **)(*local_28 + 0x18))();
      if (sVar6 != sVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1120,"ERROR: Silf table - pseudo search start",&local_1121);
        OutputError((int *)in_stack_ffffffffffffe9e0,
                    (TestCase *)CONCAT44(uVar11,in_stack_ffffffffffffe9d8),
                    (string *)in_stack_ffffffffffffe9d0,
                    (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
        std::__cxx11::string::~string(local_1120);
        std::allocator<char>::~allocator((allocator<char> *)&local_1121);
      }
      for (local_8cc = 0; local_8cc < (int)local_1088; local_8cc = local_8cc + 1) {
        if (local_34 < 0x10001) {
          uVar5 = (**(code **)(*local_20 + 0x18))();
          local_1128 = (uint)uVar5;
        }
        else {
          local_1128 = (**(code **)(*local_20 + 0x20))();
        }
        if (local_38 < 0x10001) {
          uVar5 = (**(code **)(*local_28 + 0x18))();
          local_112c = (uint)uVar5;
        }
        else {
          local_112c = (**(code **)(*local_28 + 0x20))();
        }
        if (local_1128 != local_112c) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1150,"ERROR: Silf table - unicode for pseudo",&local_1151);
          OutputError((int *)in_stack_ffffffffffffe9e0,
                      (TestCase *)CONCAT44(uVar11,in_stack_ffffffffffffe9d8),
                      (string *)in_stack_ffffffffffffe9d0,
                      (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
          std::__cxx11::string::~string(local_1150);
          std::allocator<char>::~allocator((allocator<char> *)&local_1151);
        }
        sVar6 = (**(code **)(*local_20 + 0x18))();
        sVar7 = (**(code **)(*local_28 + 0x18))();
        if (sVar6 != sVar7) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1178,"ERROR: Silf table = pseudo value",&local_1179);
          OutputError((int *)in_stack_ffffffffffffe9e0,
                      (TestCase *)CONCAT44(uVar11,in_stack_ffffffffffffe9d8),
                      (string *)in_stack_ffffffffffffe9d0,
                      (int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20));
          std::__cxx11::string::~string(local_1178);
          std::allocator<char>::~allocator((allocator<char> *)&local_1179);
        }
      }
      CompareClassMaps((int *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70),
                       (TestCase *)in_stack_ffffffffffffec68,in_stack_ffffffffffffec60,
                       in_stack_ffffffffffffec58,in_stack_ffffffffffffec54);
      if ((local_1059 & 1) != 0) {
        ComparePasses(in_stack_fffffffffffff140,in_stack_fffffffffffff138,in_stack_fffffffffffff130,
                      in_stack_fffffffffffff128,in_stack_fffffffffffff124,in_stack_fffffffffffff120,
                      in_stack_fffffffffffff150,in_stack_fffffffffffff158,in_stack_fffffffffffff160,
                      in_stack_fffffffffffff168);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"ERROR: Unknown Silf table version in test font",&local_59);
    OutputError((int *)in_stack_ffffffffffffe9e0,
                (TestCase *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                (string *)in_stack_ffffffffffffe9d0,iVar9);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void CompareSilfTables(int & ec, TestCase * ptcase, GrIStream & grstrmB, GrIStream & grstrmT,
	int * pchwMaxGlyphID)
{
	int fxdSilfVersionB = ReadVersion(grstrmB);
	int fxdSilfVersionT = ReadVersion(grstrmT);

	Assert(fxdSilfVersionB <= kSilfVersion);
	if (fxdSilfVersionT > kSilfVersion)
	{
		OutputError(ec, ptcase, "ERROR: Unknown Silf table version in test font");
		return;
	}

	if (fxdSilfVersionB >= 0x00030000)
		 // compiler version
		grstrmB.ReadIntFromFont();
	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.ReadIntFromFont();

	//	number of tables
	unsigned short cSubTablesB = grstrmB.ReadUShortFromFont();
	Assert(cSubTablesB == 1);	// for now
	Assert(cSubTablesB <= kMaxSubTablesInFont);
	unsigned short cSubTablesT = grstrmT.ReadUShortFromFont();
	if (cSubTablesT < 1)
	{
		OutputError(ec, ptcase, "ERROR: Silf table has no subtable");
		return;
	}
	if (cSubTablesT > 1)
		OutputError(ec, ptcase, "ERROR: Silf table has greater than 1 subtable");

    if (fxdSilfVersionB >= 0x00020000)
		// reserved
		grstrmB.ReadShortFromFont();
	if (fxdSilfVersionT >= 0x00020000)
		grstrmT.ReadShortFromFont();

	//	subtable offsets
	int nSubTableOffsetsB[kMaxSubTablesInFont];
	int nSubTableOffsetsT[kMaxSubTablesInFont];
	int i;
	for (i = 0; i < cSubTablesB; i++)
		nSubTableOffsetsB[i] = grstrmB.ReadIntFromFont();
	for (i = 0; i < cSubTablesT; i++)
		nSubTableOffsetsT[i] = grstrmT.ReadIntFromFont();
	grstrmB.SetPositionInFont(nSubTableOffsetsB[0]);
	grstrmT.SetPositionInFont(nSubTableOffsetsT[0]);

	//	Now we are at the beginning of the desired sub-table.

	//	Get the position of the start of the table.
	long lSubTableStartB, lSubTableStartT;
	grstrmB.GetPositionInFont(&lSubTableStartB);
	grstrmT.GetPositionInFont(&lSubTableStartT);

	//	rule version
	uint32_t fxdRuleVersionB = (fxdSilfVersionB >= 0x00030000) ? ReadVersion(grstrmB) : fxdSilfVersionB;
	uint32_t fxdRuleVersionT = (fxdSilfVersionT >= 0x00030000) ? ReadVersion(grstrmT) : fxdSilfVersionT;

	long lPassBlockPosB = -1;
	long lPseudosPosB = -1;
	if (fxdSilfVersionB >= 0x00030000)
	{
		lPassBlockPosB = grstrmB.ReadUShortFromFont() + lSubTableStartB;
		lPseudosPosB = grstrmB.ReadUShortFromFont() + lSubTableStartB;
	}
	long lPassBlockPosT = -1;
	long lPseudosPosT = -1;
	if (fxdSilfVersionT >= 0x00030000)
	{
		lPassBlockPosT = grstrmT.ReadUShortFromFont() + lSubTableStartT;
		lPseudosPosT = grstrmT.ReadUShortFromFont() + lSubTableStartT;
	}

	//	maximum glyph ID
	*pchwMaxGlyphID = grstrmB.ReadUShortFromFont();
	if (grstrmT.ReadUShortFromFont() != *pchwMaxGlyphID)
	{
		OutputError(ec, ptcase, "ERROR: Silf table - maxiumum glyph ID");
		*pchwMaxGlyphID = -1;
	}

	//	extra ascent
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - extra ascent");
	// extra descent
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - extra descent");

	//	number of passes
	gr::byte cPasses = grstrmB.ReadByteFromFont();
	if (cPasses != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of passes");
	//	index of first substitution pass
	gr::byte ipassSub1 = grstrmB.ReadByteFromFont();
	if (ipassSub1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first substitution pass");
	//	index of first positioning pass
	gr::byte ipassPos1 = grstrmB.ReadByteFromFont();
	if (ipassPos1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first positioning pass");
	//	index of first justification pass
	gr::byte ipassJust1 = grstrmB.ReadByteFromFont();
	if (ipassJust1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first justification pass");
	//	index of first reordered pass, or 0xFF if no reordering
	gr::byte ipassReordered1 = grstrmB.ReadByteFromFont();
	if (ipassReordered1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first reordered pass");

	gr::byte bT, bB;
	//	flags
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - flags");

	//	range of possible cross-line-boundary contextualization
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - pre LB context");
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - post LB context");

	//	actual glyph ID for pseudo-glyph (ID of bogus attribute)
	//long posB; grstrmB.GetPositionInFont(&posB); - debuggers
	//WriteToLog("benchmark position = ", posB, "; ");
	//long posT; grstrmT.GetPositionInFont(&posT);
	//WriteToLog("test font position = ", posT, "; ");
	//gr::byte tempB = grstrmB.ReadByteFromFont();
	//WriteToLog("next byte B = ", tempB, "; ");
	//gr::byte tempT = grstrmT.ReadByteFromFont();
	//WriteToLog("next byte T = ", tempT, "\n");
	//if (tempB != tempT)
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - actual-for-pseudo attr");
	//	breakweight
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - breakweight attr");
	//	directionality
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - directionality attr");

	if (fxdSilfVersionB >= 0x00020000 && fxdSilfVersionT >= 0x00020000)
	{
		if (fxdSilfVersionB >= 0x00040000) {
			if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
				OutputError(ec, ptcase, "ERROR: Silf table - mirroring attrs");
			if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
				OutputError(ec, ptcase, "ERROR: Silf table - skip-passes attr");
		}
		else
		{
			// reserved
			grstrmB.ReadByteFromFont();
			grstrmT.ReadByteFromFont();

			grstrmB.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
		}		

		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels != grstrmT.ReadByteFromFont())
		{
			OutputError(ec, ptcase, "ERROR: Silf table - justification levels");
			return;
		}
		for (int i = 0; i < cJLevels; i++)
		{
			//	justification glyph attribute IDs
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - stretch", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - shrink", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - step", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - weight", i);
			grstrmB.ReadByteFromFont(); // runto
			grstrmT.ReadByteFromFont();
			// reserved
			grstrmB.ReadByteFromFont();
			grstrmB.ReadByteFromFont();
			grstrmB.ReadByteFromFont();

			grstrmT.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
		}
	}
	else if (fxdSilfVersionB >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmB.ReadByteFromFont();
		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels > 0)
			OutputError(ec, ptcase, "ERROR: Silf table - missing justification data");
		gr::byte rgb[8];
		for (int i = 0; i < cJLevels; i++)
			grstrmB.ReadBlockFromFont(rgb, 8);
	}
	else if (fxdSilfVersionT >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmB.ReadByteFromFont();
		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels > 0)
			OutputError(ec, ptcase, "ERROR: Silf table - justification data found but not expected");
		gr::byte rgb[8];
		for (int i = 0; i < cJLevels; i++)
			grstrmB.ReadBlockFromFont(rgb, 8);
	}

	//	number of component attributes
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of components");

	//	number of user-defined slot attributes
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of user-defined slot attributes");

	//	max number of ligature components per glyph
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - max number of ligature components");

	//	directions supported
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - supported directions");

	if (fxdSilfVersionB >= 0x00040001)
	{
		if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table - collision attributes");
	}
	else
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
	}

	//	reserved
	grstrmB.ReadByteFromFont();
	grstrmB.ReadByteFromFont();
	grstrmT.ReadByteFromFont();
	grstrmT.ReadByteFromFont();

	//	critical features
	if (fxdSilfVersionB >= 0x00020000 && fxdSilfVersionT >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
		// critical features
		if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table - critical features");
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
	}
	else if (fxdSilfVersionB >= 0x00020000)
	{
		grstrmB.ReadByteFromFont();
		if (grstrmB.ReadByteFromFont() != 0)
			OutputError(ec, ptcase, "ERROR: Silf table - critical features not equal to zero");
		grstrmB.ReadByteFromFont();
	}
	else if (fxdSilfVersionT >= 0x00020000)
	{
		grstrmT.ReadByteFromFont();
		if (grstrmT.ReadByteFromFont() != 0)
			OutputError(ec, ptcase, "ERROR: Silf table - critical features found but not expected");
		grstrmT.ReadByteFromFont();
	}

	//	rendering behaviors
	int cBehaviorsB = grstrmB.ReadByteFromFont();
	int cBehaviorsT = grstrmT.ReadByteFromFont();
	if (cBehaviorsB != cBehaviorsT)
		OutputError(ec, ptcase, "ERROR: Silf table - rendering behaviors");
	for (i = 0; i < cBehaviorsB; i++)
		grstrmB.ReadUShortFromFont();
	for (i = 0; i < cBehaviorsT; i++)
		grstrmT.ReadUShortFromFont();

	//	linebreak glyph ID
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - linebreak glyph ID");

	//	Jump to the beginning of the pass offset block, if we have this information.
	if (fxdSilfVersionB >= 0x00030000)
		grstrmB.SetPositionInFont(lPassBlockPosB);
	else
		//	Otherwise assume that's where we are!
		Assert(lPassBlockPosB == -1);

	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.SetPositionInFont(lPassBlockPosT);
	else
		Assert(lPassBlockPosT == -1);

	//	offsets to passes, relative to the start of this subtable;
	//	note that we read (cPasses + 1) of these
	int rgnPassOffsets[kMaxPasses];
	bool fPassesOk = true;
	for (i = 0; i <= cPasses; i++)
	{
		rgnPassOffsets[i] = grstrmB.ReadIntFromFont();
		if (rgnPassOffsets[i] != grstrmT.ReadIntFromFont())
		{
			OutputError(ec, ptcase, "ERROR: Silf table - pass offsets", i);
			fPassesOk = false;
		}
	}

	//	Jump to the beginning of the pseudo-glyph info block, if we have this information.
	if (fxdSilfVersionB >= 0x00030000)
		grstrmB.SetPositionInFont(lPseudosPosB);
	else
		//	Otherwise assume that's where we are!
		Assert(lPseudosPosB == -1);

	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.SetPositionInFont(lPseudosPosT);
	else
		Assert(lPseudosPosT == -1);

	//	number of pseudo-glyphs and search constants
	int cpsd = grstrmB.ReadUShortFromFont();
	if (cpsd != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search count");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search increment");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search loop");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search start");

	//	unicode-to-pseudo map
	for (i = 0; i < cpsd; i++)
	{
		int unicodeB, unicodeT;
		if (fxdSilfVersionB <= 0x00010000)
			unicodeB = grstrmB.ReadUShortFromFont();
		else
			unicodeB = grstrmB.ReadIntFromFont();
		if (fxdSilfVersionT <= 0x00010000)
			unicodeT = grstrmT.ReadUShortFromFont();
		else
			unicodeT = grstrmT.ReadIntFromFont();
		if (unicodeB != unicodeT)
			OutputError(ec, ptcase, "ERROR: Silf table - unicode for pseudo", i);

		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table = pseudo value", i);
	}

	CompareClassMaps(ec, ptcase, grstrmB, grstrmT, fxdSilfVersionB);

	if (fPassesOk)
		ComparePasses(ec, ptcase, grstrmB, grstrmT,
			fxdSilfVersionB, fxdSilfVersionT, cPasses,
			lSubTableStartB, lSubTableStartT, rgnPassOffsets);
}